

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.hpp
# Opt level: O2

u32 __thiscall tl::calcSizeUtf8(tl *this,CStr32 str)

{
  uint uVar1;
  u32 uVar2;
  long lVar3;
  char32_t *__begin1;
  int iVar4;
  
  uVar2 = 0;
  for (lVar3 = 0; ((ulong)this & 0xffffffff) << 2 != lVar3; lVar3 = lVar3 + 4) {
    uVar1 = *(uint *)(str._0_8_ + lVar3);
    iVar4 = 1;
    if ((0x7f < uVar1) && (iVar4 = 2, 0x7ff < uVar1)) {
      iVar4 = 4 - (uint)(uVar1 < 0x10000);
    }
    uVar2 = uVar2 + iVar4;
  }
  return uVar2;
}

Assistant:

const CharT* end()const { return _str + _size; }